

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_shield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (!bVar1) {
    init_affect(&af);
    af.where = 0;
    af.aftype = get_spell_aftype(ch);
    af.level = (short)level;
    af.duration = af.level + 8;
    af.location = 0x11;
    af.modifier = (short)(level / 4);
    af.type = (short)sn;
    affect_to_char((CHAR_DATA *)vo,&af);
    act("$n is surrounded by a force shield.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("You are surrounded by a force shield.\n\r",(CHAR_DATA *)vo);
    return;
  }
  if ((CHAR_DATA *)vo != ch) {
    act("$N is already protected by a shield.",ch,(void *)0x0,vo,3);
    return;
  }
  send_to_char("You are already shielded from harm.\n\r",ch);
  return;
}

Assistant:

void spell_shield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already shielded from harm.\n\r", ch);
		else
			act("$N is already protected by a shield.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = 8 + level;
	af.location = APPLY_AC;
	af.modifier = level / 4;
	affect_to_char(victim, &af);

	act("$n is surrounded by a force shield.", victim, nullptr, nullptr, TO_ROOM);
	send_to_char("You are surrounded by a force shield.\n\r", victim);
}